

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTestDec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_40;
  uint local_3c;
  int nVarNum;
  int DecType;
  int fVerbose;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nVarNum = 0;
  local_3c = 0;
  local_40 = -1;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"ANvh");
      if (iVar1 == -1) {
        if (argc != globalUtilOptind + 1) {
          Abc_Print(1,"Input file is not given.\n");
          return 0;
        }
        if ((-1 < local_40) && (local_40 < 6)) {
          Abc_Print(1,"The number of variables cannot be less than 6.\n");
          return 0;
        }
        Abc_DecTest(argv[globalUtilOptind],local_3c,local_40,nVarNum);
        return 0;
      }
      if (iVar1 == 0x41) break;
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
          goto LAB_0026d657;
        }
        local_40 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (local_40 < 0) goto LAB_0026d657;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0026d657;
        nVarNum = nVarNum ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
      break;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_3c);
LAB_0026d657:
  Abc_Print(-2,"usage: testdec [-AN <num>] [-vh] <file>\n");
  Abc_Print(-2,"\t           testbench for Boolean decomposition algorithms\n");
  Abc_Print(-2,"\t-A <num> : decomposition algorithm [default = %d]\n",(ulong)local_3c);
  Abc_Print(-2,"\t               0: none (reading and writing the file)\n");
  Abc_Print(-2,"\t               1: algebraic factoring applied to ISOP\n");
  Abc_Print(-2,"\t               2: bi-decomposition with cofactoring\n");
  Abc_Print(-2,"\t               3: disjoint-support decomposition with cofactoring\n");
  Abc_Print(-2,"\t               4: updated disjoint-support decomposition with cofactoring\n");
  Abc_Print(-2,"\t               5: enumerating decomposable variable sets\n");
  Abc_Print(-2,
            "\t               6: disjoint-support decomposition with cofactoring and boolean difference analysis\n"
           );
  Abc_Print(-2,
            "\t                  from V. Callegaro, F. S. Marranghello, M. G. A. Martins, R. P. Ribas and A. I. Reis,\n"
           );
  Abc_Print(-2,
            "\t                  \"Bottom-up disjoint-support decomposition based on cofactor and boolean difference analysis,\" ICCD\'15.\n"
           );
  Abc_Print(-2,
            "\t-N <num> : the number of support variables (binary files only) [default = unused]\n")
  ;
  pcVar2 = "no";
  if (nVarNum != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  Abc_Print(-2,"\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
  Abc_Print(-2,"\t           or a binary file with an array of truth tables (in this case,\n");
  Abc_Print(-2,"\t           -N <num> is required to determine how many functions are stored)\n");
  return 1;
}

Assistant:

int Abc_CommandTestDec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_DecTest( char * pFileName, int DecType, int nVarNum, int fVerbose );
    char * pFileName;
    int c;
    int fVerbose = 0;
    int DecType = 0;
    int nVarNum = -1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ANvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            DecType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DecType < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVarNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVarNum < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( 1,"Input file is not given.\n" );
        return 0;
    }
    if ( nVarNum >= 0 && nVarNum < 6 )
    {
        Abc_Print( 1,"The number of variables cannot be less than 6.\n" );
        return 0;
    }
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the testbench
    Abc_DecTest( pFileName, DecType, nVarNum, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: testdec [-AN <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t           testbench for Boolean decomposition algorithms\n" );
    Abc_Print( -2, "\t-A <num> : decomposition algorithm [default = %d]\n", DecType );
    Abc_Print( -2, "\t               0: none (reading and writing the file)\n" );
    Abc_Print( -2, "\t               1: algebraic factoring applied to ISOP\n" );
    Abc_Print( -2, "\t               2: bi-decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               3: disjoint-support decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               4: updated disjoint-support decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               5: enumerating decomposable variable sets\n" );
    Abc_Print( -2, "\t               6: disjoint-support decomposition with cofactoring and boolean difference analysis\n" );
    Abc_Print( -2, "\t                  from V. Callegaro, F. S. Marranghello, M. G. A. Martins, R. P. Ribas and A. I. Reis,\n");
    Abc_Print( -2, "\t                  \"Bottom-up disjoint-support decomposition based on cofactor and boolean difference analysis,\" ICCD'15.\n" );
    Abc_Print( -2, "\t-N <num> : the number of support variables (binary files only) [default = unused]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
    Abc_Print( -2, "\t           or a binary file with an array of truth tables (in this case,\n");
    Abc_Print( -2, "\t           -N <num> is required to determine how many functions are stored)\n");
    return 1;
}